

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O2

void d68000_scc(m68k_info *info)

{
  cs_m68k *op;
  
  op = build_init_op(info,*(int *)((long)s_scc_lut + (ulong)(info->ir >> 6 & 0x3c)),1,1);
  get_ea_mode_op(info,op->operands,info->ir,1);
  return;
}

Assistant:

static void d68000_scc(m68k_info *info)
{
	cs_m68k* ext = build_init_op(info, s_scc_lut[(info->ir >> 8) & 0xf], 1, 1);
	get_ea_mode_op(info, &ext->operands[0], info->ir, 1);
}